

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeTypeUrlOrFullTypeName
          (ParserImpl *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  char cVar4;
  string part;
  string connector;
  string local_78;
  undefined1 *local_58;
  char *local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  string *local_38;
  
  local_38 = name;
  bVar2 = ConsumeIdentifier(this,name);
  if (bVar2) {
    paVar1 = &local_78.field_2;
    do {
      local_58 = &local_48;
      local_50 = (char *)0x0;
      local_48 = 0;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,".","");
      bVar2 = TryConsume(this,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      pcVar3 = ".";
      if (bVar2) {
LAB_003018d7:
        std::__cxx11::string::_M_replace((ulong)&local_58,0,local_50,(ulong)pcVar3);
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        local_78._M_dataplus._M_p = (pointer)paVar1;
        bVar2 = ConsumeIdentifier(this,&local_78);
        cVar4 = !bVar2;
        if (!(bool)cVar4) {
          std::__cxx11::string::_M_append((char *)local_38,(ulong)local_58);
          std::__cxx11::string::_M_append((char *)local_38,(ulong)local_78._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                   local_78.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        local_78._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"/","");
        bVar2 = TryConsume(this,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                   local_78.field_2._M_local_buf[0]) + 1);
        }
        cVar4 = '\x03';
        pcVar3 = "/";
        if (bVar2) goto LAB_003018d7;
      }
      if (local_58 != &local_48) {
        operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
      }
    } while (cVar4 == '\0');
    if (cVar4 != '\x01') {
      return true;
    }
  }
  return false;
}

Assistant:

bool ConsumeTypeUrlOrFullTypeName(std::string* name) {
    DO(ConsumeIdentifier(name));
    while (true) {
      std::string connector;
      if (TryConsume(".")) {
        connector = ".";
      } else if (TryConsume("/")) {
        connector = "/";
      } else {
        break;
      }
      std::string part;
      DO(ConsumeIdentifier(&part));
      *name += connector;
      *name += part;
    }
    return true;
  }